

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O0

optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ImprovesFeerateDiagram_abi_cxx11_
            (CTxMemPool *pool,setEntries *direct_conflicts,setEntries *all_conflicts,
            CAmount replacement_fees,int64_t replacement_vsize)

{
  long lVar1;
  Span<const_FeeFrac> chunks0;
  bool bVar2;
  partial_ordering pVar3;
  T *__x;
  optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<DiagramCheckError,_const_char_*> pVar4;
  CAmount in_stack_000000b0;
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  chunk_results;
  undefined7 in_stack_fffffffffffffe88;
  partial_ordering in_stack_fffffffffffffe8f;
  pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 uVar5;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  Span<const_FeeFrac> in_stack_ffffffffffffffb0;
  FeeFrac *in_stack_ffffffffffffffc0;
  setEntries *in_stack_ffffffffffffffc8;
  int64_t in_stack_ffffffffffffffd0;
  CTxMemPool *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxMemPool::CalculateChunksForRBF
            (in_stack_ffffffffffffffd8,in_stack_000000b0,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(setEntries *)in_stack_ffffffffffffffc0);
  bVar2 = util::
          Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
          ::has_value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
  if (bVar2) {
    util::
    Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
    ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_fffffffffffffe90,
               (type)CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
    __x = util::
          Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
          ::value((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    Span<FeeFrac_const>::Span<std::vector<FeeFrac,std::allocator<FeeFrac>>>
              ((Span<const_FeeFrac> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)in_stack_fffffffffffffe90,
               (type)CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
    chunks0.m_size = (size_t)in_stack_ffffffffffffffc8;
    chunks0.m_data = in_stack_ffffffffffffffc0;
    pVar3 = CompareChunks(chunks0,in_stack_ffffffffffffffb0);
    uVar5 = CONCAT13(pVar3._M_value,(int3)in_stack_fffffffffffffe9c);
    bVar2 = std::is_gt(in_stack_fffffffffffffe8f);
    if (bVar2) {
      std::
      optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::optional(in_RDI);
    }
    else {
      pVar4 = std::make_pair<DiagramCheckError,char_const(&)[55]>
                        ((DiagramCheckError *)__x,
                         (char (*) [55])CONCAT44(uVar5,in_stack_fffffffffffffe98));
      std::
      optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::optional<std::pair<DiagramCheckError,_const_char_*>,_true>
                ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(uVar5,pVar4.first),
                 (pair<DiagramCheckError,_const_char_*> *)pVar4.second);
    }
  }
  else {
    util::
    ErrorString<std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
              ((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::make_pair<DiagramCheckError,std::__cxx11::string>
              (&in_stack_fffffffffffffe90->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
    std::
    optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90);
    std::
    pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
    bilingual_str::~bilingual_str
              ((bilingual_str *)
               CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
  }
  util::
  Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
  ::~Result((Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffe8f._M_value,in_stack_fffffffffffffe88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<DiagramCheckError, std::string>> ImprovesFeerateDiagram(CTxMemPool& pool,
                                                const CTxMemPool::setEntries& direct_conflicts,
                                                const CTxMemPool::setEntries& all_conflicts,
                                                CAmount replacement_fees,
                                                int64_t replacement_vsize)
{
    // Require that the replacement strictly improves the mempool's feerate diagram.
    const auto chunk_results{pool.CalculateChunksForRBF(replacement_fees, replacement_vsize, direct_conflicts, all_conflicts)};

    if (!chunk_results.has_value()) {
        return std::make_pair(DiagramCheckError::UNCALCULABLE, util::ErrorString(chunk_results).original);
    }

    if (!std::is_gt(CompareChunks(chunk_results.value().second, chunk_results.value().first))) {
        return std::make_pair(DiagramCheckError::FAILURE, "insufficient feerate: does not improve feerate diagram");
    }
    return std::nullopt;
}